

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O1

bool __thiscall
GOESRProduct::matchProduct
          (GOESRProduct *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *products)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pbVar3;
  byte bVar4;
  int iVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *product;
  pointer pbVar7;
  bool bVar8;
  char cVar9;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pbVar1 = (products->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (products->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = true;
  if (pbVar1 != pbVar2) {
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (pbVar1,pbVar2,&this->product_);
    if (_Var6._M_current == pbVar2) {
      pbVar7 = (products->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (products->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar8 = pbVar7 == pbVar3;
      if (bVar8) {
        bVar8 = false;
      }
      else {
        bVar4 = 0;
        do {
          cVar9 = '\x03';
          if ((pbVar7->_M_string_length != 0) && (*(pbVar7->_M_dataplus)._M_p == '^')) {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar7);
            cVar9 = false;
            if (local_48 == (this->product_).nameShort._M_string_length) {
              if (local_48 == 0) {
                cVar9 = true;
              }
              else {
                iVar5 = bcmp(local_50,(this->product_).nameShort._M_dataplus._M_p,local_48);
                cVar9 = iVar5 == 0;
              }
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            bVar4 = 1;
          }
          if ((cVar9 != '\x03') && (cVar9 != '\0')) break;
          pbVar7 = pbVar7 + 1;
          bVar8 = pbVar7 == pbVar3;
        } while (!bVar8);
        bVar8 = (bool)(bVar8 & bVar4);
      }
    }
  }
  return bVar8;
}

Assistant:

bool GOESRProduct::matchProduct(const std::vector<std::string>& products) const {
  if (products.empty()) {
    return true;
  }

  // Check for a positive match.
  const auto begin = std::begin(products);
  const auto end = std::end(products);
  const auto it = std::find(begin, end, product_.nameShort);
  if (it != end) {
    return true;
  }

  // Check for a negative match.
  bool performed_negative_check = false;
  for (const auto& product : products) {
    if (product.empty() || product.at(0) != '^') {
      continue;
    }
    // Compare the sub-string after the negation character.
    performed_negative_check = true;
    if (product.substr(1) == product_.nameShort) {
      return false;
    }
  }

  return performed_negative_check;
}